

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

DynamicEntryList * __thiscall
cmELFInternalImpl<cmELFTypes64>::GetDynamicEntries
          (DynamicEntryList *__return_storage_ptr__,cmELFInternalImpl<cmELFTypes64> *this)

{
  pointer *pppVar1;
  iterator __position;
  bool bVar2;
  ELF_Dyn *dyn;
  pointer paVar3;
  pair<long,_unsigned_long> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = LoadDynamicSection(this);
  if (bVar2) {
    std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>::
    reserve(__return_storage_ptr__,
            (long)(this->DynamicSectionEntries).
                  super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->DynamicSectionEntries).
                  super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
                  super__Vector_impl_data._M_start >> 4);
    paVar3 = (this->DynamicSectionEntries).super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (paVar3 != (this->DynamicSectionEntries).
                  super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      do {
        local_38.first = paVar3->d_tag;
        local_38.second = *(unsigned_long *)&paVar3->d_un;
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<std::pair<long,unsigned_long>,std::allocator<std::pair<long,unsigned_long>>>::
          _M_realloc_insert<std::pair<long,unsigned_long>>
                    ((vector<std::pair<long,unsigned_long>,std::allocator<std::pair<long,unsigned_long>>>
                      *)__return_storage_ptr__,__position,&local_38);
        }
        else {
          (__position._M_current)->first = local_38.first;
          (__position._M_current)->second = local_38.second;
          pppVar1 = &(__return_storage_ptr__->
                     super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
        }
        paVar3 = paVar3 + 1;
      } while (paVar3 != (this->DynamicSectionEntries).
                         super__Vector_base<Elf64_Dyn,_std::allocator<Elf64_Dyn>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmELF::DynamicEntryList cmELFInternalImpl<Types>::GetDynamicEntries()
{
  cmELF::DynamicEntryList result;

  // Ensure entries have been read from file
  if (!this->LoadDynamicSection()) {
    return result;
  }

  // Copy into public array
  result.reserve(this->DynamicSectionEntries.size());
  for (typename std::vector<ELF_Dyn>::iterator di =
         this->DynamicSectionEntries.begin();
       di != this->DynamicSectionEntries.end(); ++di) {
    ELF_Dyn& dyn = *di;
    result.push_back(
      std::pair<unsigned long, unsigned long>(dyn.d_tag, dyn.d_un.d_val));
  }

  return result;
}